

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndiccr<(moira::Instr)61,(moira::Mode)11,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Imu im;
  StrWriter *this_00;
  
  im.raw = dasmRead<(moira::Size)1>(this,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  StrWriter::operator<<(this_00,im);
  StrWriter::operator<<(this_00,", CCR");
  return;
}

Assistant:

void
Moira::dasmAndiccr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu ( dasmRead<S>(addr)         );

    str << Ins<I>{} << tab << src << ", CCR";
}